

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O3

void __thiscall Dinic_LargeFlow_Test::TestBody(Dinic_LargeFlow_Test *this)

{
  bool bVar1;
  Flow lhs;
  char *message;
  int iVar2;
  undefined1 local_b0 [8];
  Dinic d;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  Dinic::Dinic((Dinic *)local_b0,2);
  iVar2 = 100;
  do {
    Dinic::addEdge((Dinic *)local_b0,0,1,100000000000);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  lhs = Dinic::getFlow((Dinic *)local_b0,0,1);
  testing::internal::CmpHelperEQ
            ((internal *)
             &d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,"d.getFlow(0, 1)","10000000000000ll",lhs,10000000000000);
  if ((char)d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/dinic_test.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (d.d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(d.d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (d.g.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(d.g.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&d.e.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  if (d._8_8_ != 0) {
    operator_delete((void *)d._8_8_);
  }
  return;
}

Assistant:

TEST(Dinic, LargeFlow) {
    Dinic d(2);
    rep(i, 0, 100) {
        d.addEdge(0, 1, 100000000000ll);
    }
    EXPECT_EQ(d.getFlow(0, 1), 10000000000000ll);
}